

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

short duckdb::DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,short>
                (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  short sVar2;
  int64_t extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint8_t in_R9B;
  hugeint_t value;
  hugeint_t input_00;
  string error;
  allocator local_b9;
  hugeint_t local_b8;
  hugeint_t local_a8;
  string local_88;
  string local_68;
  string local_48 [32];
  
  local_b8.upper = input.upper;
  local_b8.lower = input.lower;
  bVar1 = hugeint_t::operator>=(&local_b8,(hugeint_t *)((long)dataptr + 0x20));
  if (!bVar1) {
    local_a8 = hugeint_t::operator-((hugeint_t *)((long)dataptr + 0x20));
    bVar1 = hugeint_t::operator<=(&local_b8,&local_a8);
    if (!bVar1) {
      input_00.upper = extraout_RDX;
      input_00.lower = local_b8.upper;
      sVar2 = Cast::Operation<duckdb::hugeint_t,short>((Cast *)local_b8.lower,input_00);
      return sVar2 * *(short *)((long)dataptr + 0x30);
    }
  }
  ::std::__cxx11::string::string
            (local_48,"Casting value \"%s\" to type %s failed: value is out of range!",&local_b9);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(byte *)((long)dataptr + 0x33);
  value.upper._0_1_ = *(undefined1 *)((long)dataptr + 0x32);
  value.lower = local_b8.upper;
  value.upper._1_7_ = 0;
  Decimal::ToString_abi_cxx11_
            (&local_68,(Decimal *)local_b8.lower,value,*(byte *)((long)dataptr + 0x33),in_R9B);
  LogicalType::ToString_abi_cxx11_(&local_88,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            ((string *)&local_a8,(StringUtil *)local_48,&local_68,&local_88,params_1);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string(local_48);
  sVar2 = HandleVectorCastError::Operation<short>
                    ((string *)&local_a8,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  ::std::__cxx11::string::~string((string *)&local_a8);
  return sVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}